

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O1

void google::protobuf::compiler::cpp::GenerateSerializationLoop
               (Printer *printer,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,bool supports_arenas,string *utf8_check,string *loop_header,string *ptr,
               bool loop_via_iterators)

{
  AlphaNum *in_stack_fffffffffffffeb8;
  string local_140;
  undefined1 local_120 [48];
  AlphaNum local_f0;
  AlphaNum local_c0;
  char *local_90;
  size_type local_88;
  AlphaNum local_60;
  
  local_90 = "::google::protobuf::scoped_ptr<$map_classname$> entry;\n";
  local_88 = 0x37;
  local_c0.piece_data_ = (loop_header->_M_dataplus)._M_p;
  local_c0.piece_size_ = loop_header->_M_string_length;
  local_f0.piece_data_ = " {\n";
  local_f0.piece_size_ = 3;
  StrCat_abi_cxx11_((string *)local_120,(protobuf *)&local_90,&local_c0,&local_f0,
                    (AlphaNum *)loop_header);
  io::Printer::Print(printer,variables,(char *)local_120._0_8_);
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  io::Printer::Indent(printer);
  local_90 = "entry.reset($name$_.New$wrapper$(\n    ";
  local_88 = 0x26;
  local_120._0_8_ = (ptr->_M_dataplus)._M_p;
  local_120._8_8_ = ptr->_M_string_length;
  local_f0.piece_data_ = "->first, ";
  local_f0.piece_size_ = 9;
  local_60.piece_data_ = "->second));\n$write_entry$;\n";
  local_60.piece_size_ = 0x1b;
  local_c0.piece_data_ = (char *)local_120._0_8_;
  local_c0.piece_size_ = local_120._8_8_;
  StrCat_abi_cxx11_(&local_140,(protobuf *)&local_90,&local_c0,&local_f0,(AlphaNum *)local_120,
                    &local_60,in_stack_fffffffffffffeb8);
  io::Printer::Print(printer,variables,local_140._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (supports_arenas) {
    io::Printer::Print(printer,"if (entry->GetArena() != NULL) {\n  entry.release();\n}\n");
  }
  if (utf8_check->_M_string_length != 0) {
    local_90 = (utf8_check->_M_dataplus)._M_p;
    local_c0.piece_data_ = "(";
    local_c0.piece_size_ = 1;
    local_f0.piece_data_ = "";
    if (loop_via_iterators) {
      local_f0.piece_data_ = "&*";
    }
    local_f0.piece_size_ = (size_t)((uint)loop_via_iterators * 2);
    local_120._0_8_ = (ptr->_M_dataplus)._M_p;
    local_120._8_8_ = ptr->_M_string_length;
    local_60.piece_data_ = ");\n";
    local_60.piece_size_ = 3;
    local_88 = utf8_check->_M_string_length;
    StrCat_abi_cxx11_(&local_140,(protobuf *)&local_90,&local_c0,&local_f0,(AlphaNum *)local_120,
                      &local_60,in_stack_fffffffffffffeb8);
    io::Printer::Print(printer,local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

static void GenerateSerializationLoop(io::Printer* printer,
                                      const std::map<string, string>& variables,
                                      bool supports_arenas,
                                      const string& utf8_check,
                                      const string& loop_header,
                                      const string& ptr,
                                      bool loop_via_iterators) {
  printer->Print(variables,
      StrCat("::google::protobuf::scoped_ptr<$map_classname$> entry;\n",
             loop_header, " {\n").c_str());
  printer->Indent();

  printer->Print(variables, StrCat(
      "entry.reset($name$_.New$wrapper$(\n"
      "    ", ptr, "->first, ", ptr, "->second));\n"
      "$write_entry$;\n").c_str());

  // If entry is allocated by arena, its desctructor should be avoided.
  if (supports_arenas) {
    printer->Print(
        "if (entry->GetArena() != NULL) {\n"
        "  entry.release();\n"
        "}\n");
  }

  if (!utf8_check.empty()) {
    // If loop_via_iterators is true then ptr is actually an iterator, and we
    // create a pointer by prefixing it with "&*".
    printer->Print(
        StrCat(utf8_check, "(", (loop_via_iterators ? "&*" : ""), ptr, ");\n")
            .c_str());
  }

  printer->Outdent();
  printer->Print(
      "}\n");
}